

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTPNDelegated::gen_code_member
          (CTPNDelegated *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,
          int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  int iVar2;
  CTcPrsNode *pCVar3;
  undefined4 in_EAX;
  uint uVar4;
  undefined4 in_register_0000000c;
  size_t __n;
  CTcGenTarg *pCVar5;
  undefined4 uStack_38;
  int local_34;
  
  __n = CONCAT44(in_register_0000000c,prop_is_expr);
  _uStack_38 = CONCAT44(discard,in_EAX);
  if ((G_cs->field_0xa8 & 1) == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  if ((~G_cg->field_0xd0 & 0x18) != 0) {
    pCVar3 = (this->super_CTPNDelegatedBase).delegatee_;
    (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
    if (varargs != 0) {
      CTcGenTarg::write_op(G_cg,0x8d);
    }
    uVar4 = (*(prop_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                      (prop_expr,0,(ulong)(uint)prop_is_expr);
    if ((short)uVar4 == 0) {
      if (varargs != 0) {
        CTcGenTarg::write_op(G_cg,0x8d);
        CTcGenTarg::write_op(G_cg,'v');
      }
      CTcGenTarg::write_op(G_cg,'x');
      uStack_38 = CONCAT13((char)argc,(undefined3)uStack_38);
      pCVar5 = (CTcGenTarg *)G_cs;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 3,(void *)0x1,__n);
      G_cg->sp_depth_ = (G_cg->sp_depth_ - argc) + -2;
    }
    else {
      if (varargs != 0) {
        CTcGenTarg::write_op(G_cg,'v');
      }
      CTcGenTarg::write_op(G_cg,'w');
      uStack_38._0_3_ = CONCAT12((char)argc,(undefined2)uStack_38);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 2,(void *)0x1,__n);
      pCVar5 = (CTcGenTarg *)G_cs;
      CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4 & 0xffff);
      G_cg->sp_depth_ = G_cg->sp_depth_ + ~argc;
    }
    CTcGenTarg::post_call_cleanup(pCVar5,named_args);
    if (local_34 == 0) {
      CTcGenTarg::write_op(G_cg,0x8b);
      pCVar5 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (pCVar5->max_sp_depth_ <= iVar2) {
        pCVar5->max_sp_depth_ = iVar1;
      }
    }
    return;
  }
  err_throw(0x9c5);
}

Assistant:

void CTPNDelegated::gen_code_member(int discard,
                                    CTcPrsNode *prop_expr, int prop_is_expr,
                                    int argc, int varargs,
                                    CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* 
     *   make sure "self" is available - we obviously can't delegate
     *   anything if we're not in an object's method 
     */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* don't allow 'delegated' in speculative evaluation mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* generate the delegatee expression */
    delegatee_->gen_code(FALSE, FALSE);

    /* if we have an argument counter, put it back on top */
    if (varargs)
        G_cg->write_op(OPC_SWAP);

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple DELEGATE; otherwise,
     *   generate a PTRDELEGATE 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* add a varargs modifier if needed */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);

        /* we have a constant property ID - generate a regular DELEGATE */
        G_cg->write_op(OPC_DELEGATE);
        G_cs->write((char)argc);
        G_cs->write_prop_id(prop);

        /* this removes arguments and the object value */
        G_cg->note_pop(argc + 1);
    }
    else
    {
        /* 
         *   if we have a varargs list, modify the call instruction that
         *   follows to make it a varargs call 
         */
        if (varargs)
        {
            /* swap the top of the stack to get the arg counter back on top */
            G_cg->write_op(OPC_SWAP);

            /* write the varargs modifier */
            G_cg->write_op(OPC_VARARGC);
        }

        /* a property pointer is on the stack - write a PTRDELEGATE */
        G_cg->write_op(OPC_PTRDELEGATE);
        G_cs->write((int)argc);

        /* this removes arguments, the object, and the property pointer */
        G_cg->note_pop(argc + 2);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}